

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passes.hpp
# Opt level: O2

Program __thiscall Pass1::run(Pass1 *this,Program *program)

{
  Function *pFVar1;
  Type *pTVar2;
  Function *function;
  mapped_type *ppFVar3;
  Function *extraout_RDX;
  Program PVar4;
  FunctionTable function_table;
  FunctionTableKey new_key;
  FileTable file_table;
  
  pFVar1 = program->first;
  file_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &file_table._M_t._M_impl.super__Rb_tree_header._M_header;
  file_table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  file_table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  file_table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  function_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &function_table._M_t._M_impl.super__Rb_tree_header._M_header;
  function_table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  function_table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  function_table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_Visitor<const_Expression_*>)._vptr_Visitor = (_func_int **)0x0;
  this->old_program = (Program *)0x0;
  new_key.argument_types.super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  new_key.argument_types.super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  new_key.argument_types.super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  function_table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       function_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  new_key.old_function = pFVar1;
  file_table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       file_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  function = (Function *)operator_new(0x60);
  pTVar2 = pFVar1->return_type;
  (function->path)._M_dataplus._M_p = (pointer)&(function->path).field_2;
  (function->path)._M_string_length = 0;
  (function->path).field_2._M_local_buf[0] = '\0';
  (function->block).first = (Expression *)0x0;
  (function->block).last = (Expression *)0x0;
  function->arguments = 0;
  (function->argument_types).super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (function->argument_types).super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (function->argument_types).super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  function->return_type = pTVar2;
  function->next_function = (Function *)0x0;
  Program::add_function((Program *)this,function);
  ppFVar3 = std::
            map<Pass1::FunctionTableKey,_Function_*,_std::less<Pass1::FunctionTableKey>,_std::allocator<std::pair<const_Pass1::FunctionTableKey,_Function_*>_>_>
            ::operator[](&function_table,&new_key);
  *ppFVar3 = function;
  evaluate(program,(Program *)this,&file_table,&function_table,&new_key,&function->block,
           &(new_key.old_function)->block);
  std::_Vector_base<const_Type_*,_std::allocator<const_Type_*>_>::~_Vector_base
            (&new_key.argument_types.super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>
            );
  std::
  _Rb_tree<Pass1::FunctionTableKey,_std::pair<const_Pass1::FunctionTableKey,_Function_*>,_std::_Select1st<std::pair<const_Pass1::FunctionTableKey,_Function_*>_>,_std::less<Pass1::FunctionTableKey>,_std::allocator<std::pair<const_Pass1::FunctionTableKey,_Function_*>_>_>
  ::~_Rb_tree(&function_table._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>_>_>
  ::~_Rb_tree(&file_table._M_t);
  PVar4.last = extraout_RDX;
  PVar4.first = (Function *)this;
  return PVar4;
}

Assistant:

static Program run(Program& program) {
		const Function* main_function = program.get_main_function();
		Program new_program;
		FileTable file_table;
		FunctionTable function_table;
		FunctionTableKey new_key(main_function);
		Function* new_function = new Function(main_function->get_return_type());
		new_program.add_function(new_function);
		function_table[new_key] = new_function;
		evaluate(&program, &new_program, file_table, function_table, new_key, new_function->get_block(), new_key.old_function->get_block());
		return new_program;
	}